

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_rename_to_existing_file(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_buf_t uVar4;
  
  unlink("test_file");
  unlink("test_file2");
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  uVar4.len = iov.len;
  uVar4.base = iov.base;
  if (iVar1 < 0) {
    pcVar3 = "r >= 0";
    uVar2 = 0xb0c;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar3 = "open_req1.result >= 0";
    uVar2 = 0xb0d;
    iov = uVar4;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar1 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff,0);
    if (iVar1 < 0) {
      pcVar3 = "r >= 0";
      uVar2 = 0xb12;
    }
    else if (write_req.result < 0) {
      pcVar3 = "write_req.result >= 0";
      uVar2 = 0xb13;
    }
    else {
      uv_fs_req_cleanup(&write_req);
      iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
      if (iVar1 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          iVar1 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
          if (iVar1 < 0) {
            pcVar3 = "r >= 0";
            uVar2 = 0xb1d;
          }
          else if (open_req1.result._4_4_ < 0) {
            pcVar3 = "open_req1.result >= 0";
            uVar2 = 0xb1e;
          }
          else {
            uv_fs_req_cleanup(&open_req1);
            iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
            if (iVar1 == 0) {
              if (close_req.result == 0) {
                uv_fs_req_cleanup(&close_req);
                iVar1 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
                if (iVar1 == 0) {
                  if (rename_req.result == 0) {
                    uv_fs_req_cleanup(&rename_req);
                    iVar1 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
                    if (iVar1 < 0) {
                      pcVar3 = "r >= 0";
                      uVar2 = 0xb2c;
                    }
                    else if (open_req1.result._4_4_ < 0) {
                      pcVar3 = "open_req1.result >= 0";
                      uVar2 = 0xb2d;
                    }
                    else {
                      uv_fs_req_cleanup(&open_req1);
                      buf[0x10] = '\0';
                      buf[0x11] = '\0';
                      buf[0x12] = '\0';
                      buf[0x13] = '\0';
                      buf[0x14] = '\0';
                      buf[0x15] = '\0';
                      buf[0x16] = '\0';
                      buf[0x17] = '\0';
                      buf[0x18] = '\0';
                      buf[0x19] = '\0';
                      buf[0x1a] = '\0';
                      buf[0x1b] = '\0';
                      buf[0x1c] = '\0';
                      buf[0x1d] = '\0';
                      buf[0x1e] = '\0';
                      buf[0x1f] = '\0';
                      buf[0] = '\0';
                      buf[1] = '\0';
                      buf[2] = '\0';
                      buf[3] = '\0';
                      buf[4] = '\0';
                      buf[5] = '\0';
                      buf[6] = '\0';
                      buf[7] = '\0';
                      buf[8] = '\0';
                      buf[9] = '\0';
                      buf[10] = '\0';
                      buf[0xb] = '\0';
                      buf[0xc] = '\0';
                      buf[0xd] = '\0';
                      buf[0xe] = '\0';
                      buf[0xf] = '\0';
                      uVar4 = (uv_buf_t)uv_buf_init(buf,0x20);
                      iov = uVar4;
                      iVar1 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,
                                         0xffffffffffffffff,0);
                      if (iVar1 < 0) {
                        pcVar3 = "r >= 0";
                        uVar2 = 0xb33;
                      }
                      else if (read_req.result < 0) {
                        pcVar3 = "read_req.result >= 0";
                        uVar2 = 0xb34;
                      }
                      else {
                        iVar1 = strcmp(buf,test_buf);
                        if (iVar1 == 0) {
                          uv_fs_req_cleanup(&read_req);
                          iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
                          if (iVar1 == 0) {
                            if (close_req.result == 0) {
                              uv_fs_req_cleanup(&close_req);
                              unlink("test_file");
                              unlink("test_file2");
                              loop = (uv_loop_t *)uv_default_loop();
                              close_loop(loop);
                              uVar2 = uv_default_loop();
                              iVar1 = uv_loop_close(uVar2);
                              if (iVar1 == 0) {
                                return 0;
                              }
                              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                              uVar2 = 0xb41;
                            }
                            else {
                              pcVar3 = "close_req.result == 0";
                              uVar2 = 0xb3a;
                            }
                          }
                          else {
                            pcVar3 = "r == 0";
                            uVar2 = 0xb39;
                          }
                        }
                        else {
                          pcVar3 = "strcmp(buf, test_buf) == 0";
                          uVar2 = 0xb35;
                        }
                      }
                    }
                  }
                  else {
                    pcVar3 = "rename_req.result == 0";
                    uVar2 = 0xb28;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uVar2 = 0xb27;
                }
              }
              else {
                pcVar3 = "close_req.result == 0";
                uVar2 = 0xb23;
              }
            }
            else {
              pcVar3 = "r == 0";
              uVar2 = 0xb22;
            }
          }
        }
        else {
          pcVar3 = "close_req.result == 0";
          uVar2 = 0xb18;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0xb17;
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_rename_to_existing_file) {
  int r;

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_rename(NULL, &rename_req, "test_file", "test_file2", NULL);
  ASSERT(r == 0);
  ASSERT(rename_req.result == 0);
  uv_fs_req_cleanup(&rename_req);

  r = uv_fs_open(NULL, &open_req1, "test_file2", O_RDONLY, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}